

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int __thiscall CTPNSuperclass::is_subclass_of(CTPNSuperclass *this,CTPNSuperclass *other)

{
  int iVar1;
  uint uVar2;
  CTcSymbol *pCVar3;
  CTPNSuperclass *this_00;
  
  if ((other->sym_len_ == this->sym_len_) &&
     (iVar1 = bcmp(other->sym_txt_,this->sym_txt_,this->sym_len_), iVar1 == 0)) {
    return 1;
  }
  pCVar3 = get_sym(this);
  uVar2 = 0;
  if (((pCVar3 != (CTcSymbol *)0x0) &&
      (uVar2 = 0,
      *(int *)&(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 2
      )) && (uVar2 = 0,
            (int)pCVar3[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_ == 0)) {
    this_00 = (CTPNSuperclass *)
              pCVar3[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry;
    while ((this_00 != (CTPNSuperclass *)0x0 && (iVar1 = is_subclass_of(this_00,other), iVar1 == 0))
          ) {
      this_00 = this_00->nxt_;
    }
    uVar2 = (uint)(this_00 != (CTPNSuperclass *)0x0);
  }
  return uVar2;
}

Assistant:

int CTPNSuperclass::is_subclass_of(const CTPNSuperclass *other) const
{
    /* 
     *   if my name matches, we're a subclass (we are a subclass of
     *   ourselves) 
     */
    if (other->sym_len_ == sym_len_
        && memcmp(other->sym_txt_, sym_txt_, sym_len_) == 0)
        return TRUE;

    /* 
     *   We're a subclass if any of our superclasses are subclasses of the
     *   given object.  Get my object symbol, and make sure it's really a
     *   tads-object - if it's not, we're definitely not a subclass of
     *   anything.  
     */
    CTcSymObj *sym = (CTcSymObj *)get_sym();
    if (sym == 0
        || sym->get_type() != TC_SYM_OBJ
        || sym->get_metaclass() != TC_META_TADSOBJ)
        return FALSE;

    /* scan our symbol's superclass list for a match */
    for (CTPNSuperclass *sc = sym->get_sc_name_head() ;
         sc != 0 ; sc = sc->nxt_)
    {
        /* 
         *   if this one's a subclass of the given class, we're a subclass
         *   as well, since we're a subclass of this superclass 
         */
        if (sc->is_subclass_of(other))
            return TRUE;
    }

    /* 
     *   we didn't find any superclass that's a subclass of the given
     *   class, so we're not a subclass of the given class 
     */
    return FALSE;
}